

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O3

void do_connect(uv_loop_t *loop,uv_tcp_t *tcp_client)

{
  int iVar1;
  int iVar2;
  uv_loop_t *puVar3;
  undefined8 *extraout_RDX;
  uv_tcp_t *handle;
  sockaddr_in addr;
  sockaddr_in sStack_18;
  
  handle = (uv_tcp_t *)0x23a3;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_18);
  if (iVar1 == 0) {
    handle = &::tcp_client;
    iVar1 = uv_tcp_init(loop,&::tcp_client);
    if (iVar1 != 0) goto LAB_0016f244;
    handle = &::tcp_client;
    iVar1 = uv_tcp_connect(&connect_req,&::tcp_client,(sockaddr *)&sStack_18,connect_cb);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    do_connect_cold_1();
LAB_0016f244:
    do_connect_cold_2();
  }
  do_connect_cold_3();
  ::loop = uv_default_loop();
  start_server(::loop,handle);
  client_close = 1;
  shutdown_before_close = 1;
  do_connect(::loop,handle);
  if (write_cb_called == 0) {
    if (close_cb_called != 0) goto LAB_0016f302;
    if (shutdown_cb_called != 0) goto LAB_0016f307;
    handle = (uv_tcp_t *)0x0;
    iVar1 = uv_run(::loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016f30c;
    if (write_cb_called != 4) goto LAB_0016f311;
    if (close_cb_called != 0) goto LAB_0016f316;
    if (shutdown_cb_called != 1) goto LAB_0016f31b;
    puVar3 = uv_default_loop();
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    handle = (uv_tcp_t *)0x0;
    uv_run(puVar3,UV_RUN_DEFAULT);
    puVar3 = uv_default_loop();
    iVar1 = uv_loop_close(puVar3);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    run_test_tcp_close_reset_client_after_shutdown_cold_1();
LAB_0016f302:
    run_test_tcp_close_reset_client_after_shutdown_cold_2();
LAB_0016f307:
    run_test_tcp_close_reset_client_after_shutdown_cold_3();
LAB_0016f30c:
    run_test_tcp_close_reset_client_after_shutdown_cold_4();
LAB_0016f311:
    run_test_tcp_close_reset_client_after_shutdown_cold_5();
LAB_0016f316:
    run_test_tcp_close_reset_client_after_shutdown_cold_6();
LAB_0016f31b:
    run_test_tcp_close_reset_client_after_shutdown_cold_7();
  }
  run_test_tcp_close_reset_client_after_shutdown_cold_8();
  ::loop = uv_default_loop();
  start_server(::loop,handle);
  client_close = 0;
  shutdown_before_close = 0;
  do_connect(::loop,handle);
  if (write_cb_called == 0) {
    if (close_cb_called != 0) goto LAB_0016f3d9;
    if (shutdown_cb_called != 0) goto LAB_0016f3de;
    handle = (uv_tcp_t *)0x0;
    iVar1 = uv_run(::loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016f3e3;
    if (write_cb_called != 4) goto LAB_0016f3e8;
    if (close_cb_called != 1) goto LAB_0016f3ed;
    if (shutdown_cb_called != 0) goto LAB_0016f3f2;
    puVar3 = uv_default_loop();
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    handle = (uv_tcp_t *)0x0;
    uv_run(puVar3,UV_RUN_DEFAULT);
    puVar3 = uv_default_loop();
    iVar1 = uv_loop_close(puVar3);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    run_test_tcp_close_reset_accepted_cold_1();
LAB_0016f3d9:
    run_test_tcp_close_reset_accepted_cold_2();
LAB_0016f3de:
    run_test_tcp_close_reset_accepted_cold_3();
LAB_0016f3e3:
    run_test_tcp_close_reset_accepted_cold_4();
LAB_0016f3e8:
    run_test_tcp_close_reset_accepted_cold_5();
LAB_0016f3ed:
    run_test_tcp_close_reset_accepted_cold_6();
LAB_0016f3f2:
    run_test_tcp_close_reset_accepted_cold_7();
  }
  run_test_tcp_close_reset_accepted_cold_8();
  ::loop = uv_default_loop();
  start_server(::loop,handle);
  client_close = 0;
  shutdown_before_close = 1;
  puVar3 = ::loop;
  do_connect(::loop,handle);
  iVar1 = (int)handle;
  if (write_cb_called == 0) {
    if (close_cb_called != 0) goto LAB_0016f4b0;
    if (shutdown_cb_called != 0) goto LAB_0016f4b5;
    iVar1 = 0;
    puVar3 = ::loop;
    iVar2 = uv_run(::loop,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0016f4ba;
    if (write_cb_called != 4) goto LAB_0016f4bf;
    if (close_cb_called != 0) goto LAB_0016f4c4;
    if (shutdown_cb_called != 1) goto LAB_0016f4c9;
    puVar3 = uv_default_loop();
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    iVar1 = 0;
    uv_run(puVar3,UV_RUN_DEFAULT);
    puVar3 = uv_default_loop();
    iVar2 = uv_loop_close(puVar3);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    run_test_tcp_close_reset_accepted_after_shutdown_cold_1();
LAB_0016f4b0:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_2();
LAB_0016f4b5:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_3();
LAB_0016f4ba:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_4();
LAB_0016f4bf:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_5();
LAB_0016f4c4:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_6();
LAB_0016f4c9:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_7();
  }
  run_test_tcp_close_reset_accepted_after_shutdown_cold_8();
  if (iVar1 == 0) {
    iVar1 = uv_tcp_init(::loop,&tcp_accepted);
    if (iVar1 == 0) {
      iVar1 = uv_accept((uv_stream_t *)puVar3,(uv_stream_t *)&tcp_accepted);
      if (iVar1 == 0) {
        uv_read_start((uv_stream_t *)&tcp_accepted,alloc_cb,read_cb);
        return;
      }
      goto LAB_0016f52a;
    }
  }
  else {
    connection_cb_cold_1();
  }
  connection_cb_cold_2();
LAB_0016f52a:
  connection_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x400;
  return;
}

Assistant:

static void do_connect(uv_loop_t* loop, uv_tcp_t* tcp_client) {
  struct sockaddr_in addr;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_init(loop, tcp_client);
  ASSERT(r == 0);

  r = uv_tcp_connect(&connect_req,
                     tcp_client,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT(r == 0);
}